

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

uint32_t __thiscall ddd::DaTrie<false,_true,_false>::num_singles(DaTrie<false,_true,_false> *this)

{
  byte bVar1;
  pointer pBVar2;
  pointer pNVar3;
  Bc BVar4;
  uint32_t uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pBVar2) >> 3;
  if ((int)uVar6 != 0) {
    pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar5 = 0;
    do {
      BVar4 = pBVar2[uVar7];
      if ((long)BVar4 < 0) {
        if (((ulong)BVar4 & 0x7fffffff) != 0x7fffffff && -1 < BVar4._0_4_) {
          bVar1 = pNVar3[uVar7].child;
          uVar5 = uVar5 + (pNVar3[(uint)((ulong)BVar4 & 0x7fffffff) ^ (uint)bVar1].sib == bVar1);
        }
      }
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0xffffffff) != uVar7);
    return uVar5;
  }
  return 0;
}

Assistant:

uint32_t num_singles() const { // not in constant time
    uint32_t ret = 0;
    for (uint32_t i = 0; i < bc_size(); ++i) {
      if (!bc_[i].is_fixed()) {
        continue;
      }
      if (edge_size_(i, 2) == 1) {
        ++ret;
      }
    }
    return ret;
  }